

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O2

int cache_put6(uint64_t a,uint64_t b,uint64_t c,uint64_t d,uint64_t e,uint64_t f,uint64_t res1,
              uint64_t res2)

{
  ulong uVar1;
  uint32_t *puVar2;
  uint64_t uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  cache_entry_t pcVar7;
  bool bVar8;
  
  uVar3 = cache_hash6(a,b,c,d,e,f);
  puVar2 = cache_status;
  iVar5 = 0;
  uVar6 = (cache_mask & uVar3) >> 1;
  pcVar7 = cache_table + uVar6 * 2;
  uVar1 = *(ulong *)(cache_status + uVar6 * 2);
  if ((uVar1 & 0x8000000080000000) == 0) {
    uVar4 = (ulong)((uint)(uVar3 >> 0x20) & 0x7bff0000);
    uVar4 = uVar4 + 0x4000000 +
            ((ulong)((int)uVar1 + 1U & 0xffff) |
            uVar1 + 0x100000000 & 0xffff00000000 | uVar4 + 0x4000000 << 0x20);
    LOCK();
    bVar8 = uVar1 == *(ulong *)(cache_status + uVar6 * 2);
    if (bVar8) {
      *(ulong *)(cache_status + uVar6 * 2) = uVar4 | 0x8000000080000000;
    }
    UNLOCK();
    if (bVar8) {
      pcVar7->a = a;
      pcVar7->b = b;
      pcVar7->c = c;
      pcVar7[1].a = d;
      pcVar7[1].b = e;
      pcVar7[1].c = f;
      pcVar7->res = res1;
      pcVar7[1].res = res2;
      *(ulong *)(puVar2 + uVar6 * 2) = uVar4;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int
cache_put6(uint64_t a, uint64_t b, uint64_t c, uint64_t d, uint64_t e, uint64_t f, uint64_t res1, uint64_t res2)
{
    const uint64_t hash = cache_hash6(a, b, c, d, e, f);
#if CACHE_MASK
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash & cache_mask)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash & cache_mask)/2;
#else
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash % cache_size)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash % cache_size)/2;
#endif
    // can be relaxed, we use cas afterwards to claim it
    uint64_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked
    if (s & 0x8000000080000000LL) return 0;
    // create new
    uint64_t new_s = ((hash>>32) & 0x7fff0000) | 0x04000000;
    new_s |= (new_s<<32);
    new_s |= (((s>>32)+1)&0xffff)<<32;
    new_s |= (s+1)&0xffff;
    // use cas to claim bucket
    if (!atomic_compare_exchange_weak(s_bucket, &s, new_s | 0x8000000080000000LL)) return 0;
    // cas succesful: write data
    bucket->a = a;
    bucket->b = b;
    bucket->c = c;
    bucket->d = d;
    bucket->e = e;
    bucket->f = f;
    bucket->res = res1;
    bucket->res2 = res2;
    // unlock status field
    atomic_store_explicit(s_bucket, new_s, memory_order_release);
    return 1;
}